

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_GetPegoutPubkeyDataTest_Test::TestBody
          (ConfidentialTransaction_GetPegoutPubkeyDataTest_Test *this)

{
  pointer pGVar1;
  bool bVar2;
  pointer pGVar3;
  char *pcVar4;
  uint32_t bip32_counter;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_3;
  AssertHelper local_3e0;
  ByteData pubkey_prefix;
  ByteData whitelist;
  Pubkey online_pubkey;
  string bitcoin_descriptor;
  PegoutKeyData key_data;
  Privkey master_online_key;
  Address pegout_addr;
  Address addr;
  
  std::__cxx11::string::string
            ((string *)&addr,"02a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da",
             (allocator *)&pegout_addr);
  cfd::core::Pubkey::Pubkey(&online_pubkey,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  std::__cxx11::string::string
            ((string *)&addr,"cPoefvB147bYpWCf9JqRBVMXENt4isSBAn91RYeiBh1jUp3ThhKN",
             (allocator *)&pegout_addr);
  cfd::core::Privkey::FromWif(&master_online_key,(string *)&addr,kTestnet,true);
  std::__cxx11::string::~string((string *)&addr);
  std::__cxx11::string::string
            ((string *)&bitcoin_descriptor,
             "sh(wpkh(tpubDBwZbsX7C1m4tfHxHSFBvvuasqMxzMvSNM5yuAWz6kAfCATAgegvrtGdnxkqfr8wwRZi5d9fJHXqE8EFTSogTXd3xVx3GUFy9Xcg8dufREz/0/*))"
             ,(allocator *)&addr);
  std::__cxx11::string::string
            ((string *)&addr,
             "020061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c002a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da"
             ,(allocator *)&pegout_addr);
  cfd::core::ByteData::ByteData(&whitelist,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  std::__cxx11::string::string((string *)&addr,"043587cf",(allocator *)&pegout_addr);
  cfd::core::ByteData::ByteData(&pubkey_prefix,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  cfd::core::PegoutKeyData::PegoutKeyData(&key_data);
  cfd::core::Address::Address(&addr);
  pGVar1 = kGetPegoutPubkeyDataTestVector.
           super__Vector_base<GetPegoutPubkeyDataTestVector,_std::allocator<GetPegoutPubkeyDataTestVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bip32_counter = 0;
  for (pGVar3 = kGetPegoutPubkeyDataTestVector.
                super__Vector_base<GetPegoutPubkeyDataTestVector,_std::allocator<GetPegoutPubkeyDataTestVector>_>
                ._M_impl.super__Vector_impl_data._M_start; pGVar3 != pGVar1; pGVar3 = pGVar3 + 1) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        cfd::core::ConfidentialTransaction::GetPegoutPubkeyData
                  ((PegoutKeyData *)&pegout_addr,&online_pubkey,&master_online_key,
                   &bitcoin_descriptor,bip32_counter,&whitelist,kTestnet,&pubkey_prefix,
                   kElementsRegtest,&addr);
        cfd::core::PegoutKeyData::operator=(&key_data,(PegoutKeyData *)&pegout_addr);
        cfd::core::PegoutKeyData::~PegoutKeyData((PegoutKeyData *)&pegout_addr);
      }
    }
    else {
      testing::Message::Message((Message *)&pegout_addr);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x789,
                 "Expected: (key_data = ConfidentialTransaction::GetPegoutPubkeyData( online_pubkey, master_online_key, bitcoin_descriptor, bip32_counter, whitelist, net_type, pubkey_prefix, NetType::kElementsRegtest, &addr)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&pegout_addr);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&pegout_addr);
    }
    cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&pegout_addr,&key_data.btc_pubkey_bytes);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"key_data.btc_pubkey_bytes.GetHex().c_str()",
               "testdata.btc_pubkey_bytes.c_str()",(char *)pegout_addr._0_8_,
               (pGVar3->btc_pubkey_bytes)._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&pegout_addr);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&pegout_addr);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x78c,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_3,(Message *)&pegout_addr);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&pegout_addr);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)&pegout_addr,&key_data.whitelist_proof);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"key_data.whitelist_proof.GetHex().c_str()",
               "testdata.whitelist_proof.c_str()",(char *)pegout_addr._0_8_,
               (pGVar3->whitelist_proof)._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&pegout_addr);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&pegout_addr);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x78f,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_3,(Message *)&pegout_addr);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&pegout_addr);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&pegout_addr,&addr);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"addr.GetAddress().c_str()","testdata.address.c_str()",
               (char *)pegout_addr._0_8_,(pGVar3->address)._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&pegout_addr);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&pegout_addr);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x792,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_3,(Message *)&pegout_addr);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&pegout_addr);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::ConfidentialTransaction::GetPegoutAddressFromDescriptor
              (&pegout_addr,&bitcoin_descriptor,bip32_counter,kTestnet,kElementsRegtest);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar,&pegout_addr);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_3,"pegout_addr.GetAddress().c_str()","testdata.address.c_str()"
               ,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
               (pGVar3->address)._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_3.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      pcVar4 = "";
      if (gtest_ar_3.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_3e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x799,pcVar4);
      testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(&local_3e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_3.message_);
    bip32_counter = bip32_counter + 1;
    cfd::core::Address::~Address(&pegout_addr);
  }
  cfd::core::Address::~Address(&addr);
  cfd::core::PegoutKeyData::~PegoutKeyData(&key_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_prefix);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&whitelist);
  std::__cxx11::string::~string((string *)&bitcoin_descriptor);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&master_online_key);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&online_pubkey);
  return;
}

Assistant:

TEST(ConfidentialTransaction, GetPegoutPubkeyDataTest) {
  // liquid_pak
  Pubkey online_pubkey("02a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da");
  // liquid_pak_privkey
  Privkey master_online_key = Privkey::FromWif(
      "cPoefvB147bYpWCf9JqRBVMXENt4isSBAn91RYeiBh1jUp3ThhKN", NetType::kTestnet, true);
  std::string bitcoin_descriptor = "sh(wpkh(tpubDBwZbsX7C1m4tfHxHSFBvvuasqMxzMvSNM5yuAWz6kAfCATAgegvrtGdnxkqfr8wwRZi5d9fJHXqE8EFTSogTXd3xVx3GUFy9Xcg8dufREz/0/*))";
  ByteData whitelist("020061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c002a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da");
  NetType net_type = NetType::kTestnet;
  ByteData pubkey_prefix = ByteData("043587cf");
  uint32_t bip32_counter = 0;
  PegoutKeyData key_data;

  Address addr;
  for (const auto& testdata : kGetPegoutPubkeyDataTestVector) {
    EXPECT_NO_THROW(
      (key_data = ConfidentialTransaction::GetPegoutPubkeyData(
          online_pubkey, master_online_key, bitcoin_descriptor, bip32_counter,
          whitelist, net_type, pubkey_prefix, NetType::kElementsRegtest, &addr)));
    EXPECT_STREQ(
        key_data.btc_pubkey_bytes.GetHex().c_str(),
        testdata.btc_pubkey_bytes.c_str());
    EXPECT_STREQ(
        key_data.whitelist_proof.GetHex().c_str(),
        testdata.whitelist_proof.c_str());
    EXPECT_STREQ(
        addr.GetAddress().c_str(),
        testdata.address.c_str());

    auto pegout_addr = ConfidentialTransaction::GetPegoutAddressFromDescriptor(
        bitcoin_descriptor, bip32_counter, net_type,
        NetType::kElementsRegtest);
    EXPECT_STREQ(
        pegout_addr.GetAddress().c_str(),
        testdata.address.c_str());
    ++bip32_counter;
  }
}